

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesAttGroupInfo::addAnyAttDef
          (XercesAttGroupInfo *this,SchemaAttDef *toAdd,bool toClone)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *this_00;
  undefined4 extraout_var;
  SchemaAttDef *this_01;
  
  this_00 = &this->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
  if (this_00 == (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar1 = this->fMemoryManager;
    ((BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)&this_00->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409b30;
    this_00->fAdoptedElems = true;
    this_00->fCurCount = 0;
    this_00->fMaxCount = 2;
    this_00->fElemList = (SchemaAttDef **)0x0;
    this_00->fMemoryManager = pMVar1;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,0x10);
    this_00->fElemList = (SchemaAttDef **)CONCAT44(extraout_var,iVar3);
    *(SchemaAttDef **)CONCAT44(extraout_var,iVar3) = (SchemaAttDef *)0x0;
    this_00->fElemList[1] = (SchemaAttDef *)0x0;
    ((BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)&this_00->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_00409ab8;
    this->fAnyAttributes = (RefVectorOf<xercesc_4_0::SchemaAttDef> *)this_00;
  }
  if (toClone) {
    this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fMemoryManager);
    SchemaAttDef::SchemaAttDef(this_01,toAdd);
    if (this_01->fBaseAttDecl == (SchemaAttDef *)0x0) {
      this_01->fBaseAttDecl = toAdd;
    }
    this_00 = &this->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>;
    toAdd = this_01;
  }
  BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::ensureExtraCapacity(this_00,1);
  XVar2 = this_00->fCurCount;
  this_00->fElemList[XVar2] = toAdd;
  this_00->fCurCount = XVar2 + 1;
  return;
}

Assistant:

inline void XercesAttGroupInfo::addAnyAttDef(SchemaAttDef* const toAdd,
                                             const bool toClone) {

    if (!fAnyAttributes) {
        fAnyAttributes = new (fMemoryManager) RefVectorOf<SchemaAttDef>(2, true, fMemoryManager);
    }

    if (toClone) {
        SchemaAttDef* clonedAttDef = new (fMemoryManager) SchemaAttDef(toAdd);

        if (!clonedAttDef->getBaseAttDecl())
            clonedAttDef->setBaseAttDecl(toAdd);

        fAnyAttributes->addElement(clonedAttDef);
    }
    else {
        fAnyAttributes->addElement(toAdd);
    }
}